

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputBufferedStream.cpp
# Opt level: O2

void __thiscall OutputBufferedStream::~OutputBufferedStream(OutputBufferedStream *this)

{
  (this->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter =
       (_func_int **)&PTR__OutputBufferedStream_0036fc90;
  Flush(this);
  if (this->mBuffer != (Byte *)0x0) {
    operator_delete__(this->mBuffer);
  }
  if (this->mTargetStream != (IByteWriterWithPosition *)0x0) {
    (*(this->mTargetStream->super_IByteWriter)._vptr_IByteWriter[1])();
    return;
  }
  return;
}

Assistant:

OutputBufferedStream::~OutputBufferedStream(void)
{
	Flush();
	delete[] mBuffer;
	delete mTargetStream;
}